

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O0

bool __thiscall QtMWidgets::PickerPrivate::isRowsVisible(PickerPrivate *this,int start,int end)

{
  int iVar1;
  int local_34;
  QPersistentModelIndex local_30 [4];
  int i;
  QPersistentModelIndex index;
  int local_24;
  int visibleItemsCount;
  int end_local;
  int start_local;
  PickerPrivate *this_local;
  
  local_24 = this->itemsCount;
  iVar1 = Picker::count(this->q);
  if (this->itemsCount < iVar1) {
    local_24 = local_24 + 1;
  }
  QPersistentModelIndex::QPersistentModelIndex(local_30,&this->topItemIndex);
  local_34 = 0;
  do {
    if (local_24 <= local_34) {
      this_local._7_1_ = false;
LAB_001ed8e1:
      QPersistentModelIndex::~QPersistentModelIndex(local_30);
      return this_local._7_1_;
    }
    iVar1 = QPersistentModelIndex::row();
    if (start <= iVar1) {
      iVar1 = QPersistentModelIndex::row();
      if (iVar1 <= end) {
        this_local._7_1_ = true;
        goto LAB_001ed8e1;
      }
    }
    makeNextIndex(this,local_30);
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

bool
PickerPrivate::isRowsVisible( int start, int end )
{
	int visibleItemsCount = itemsCount;

	if( q->count() > itemsCount )
		++visibleItemsCount;

	QPersistentModelIndex index = topItemIndex;

	for( int i = 0; i < visibleItemsCount; ++i )
	{
		if( index.row() >= start && index.row() <= end )
			return true;

		makeNextIndex( index );
	}

	return false;
}